

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

void __thiscall
QDistanceFieldData::QDistanceFieldData(QDistanceFieldData *this,QDistanceFieldData *other)

{
  void *__dest;
  long in_RSI;
  long in_RDI;
  QSharedData *in_stack_ffffffffffffffd8;
  QSharedData *in_stack_ffffffffffffffe0;
  
  QSharedData::QSharedData(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RSI + 4);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RSI + 0x10);
  if ((*(int *)(in_RDI + 0x10) == 0) || (*(long *)(in_RSI + 0x18) == 0)) {
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  else {
    __dest = malloc((long)*(int *)(in_RDI + 0x10));
    memcpy(__dest,*(void **)(in_RSI + 0x18),(long)*(int *)(in_RDI + 0x10));
    *(void **)(in_RDI + 0x18) = __dest;
  }
  return;
}

Assistant:

QDistanceFieldData::QDistanceFieldData(const QDistanceFieldData &other)
    : QSharedData(other)
    , glyph(other.glyph)
    , width(other.width)
    , height(other.height)
    , nbytes(other.nbytes)
{
    if (nbytes && other.data)
        data = (uchar *)memcpy(malloc(nbytes), other.data, nbytes);
    else
        data = nullptr;
}